

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

bool_t ArrayAlloc(array *p,size_t Total,size_t Align)

{
  size_t sVar1;
  ulong uVar2;
  bool_t bVar3;
  
  if (Align == 0) {
    uVar2 = 0x10;
    do {
      Align = uVar2;
      if (0x3fff < Align) break;
      uVar2 = Align * 2;
    } while (Align * 8 < Total || Align * 8 - Total == 0);
  }
  sVar1 = p->_Used;
  bVar3 = Data_ReAlloc(p,-Align & (Total + Align) - 1);
  if (bVar3 != 0) {
    p->_Used = sVar1;
  }
  return (ulong)(bVar3 != 0);
}

Assistant:

bool_t ArrayAlloc(array* p,size_t Total,size_t Align)
{
    size_t Size = ArraySize(p);
    if (!Data_ReAlloc(p,SizeAlign(Total,Align)))
        return 0;
    p->_Used = Size;
    return 1;
}